

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_iso9660.c
# Opt level: O3

void idr_resolve(idr *idr,_func_void_uchar_ptr_int *fsetnum)

{
  char *pcVar1;
  int iVar2;
  isoent *piVar3;
  int iVar4;
  idrent *self;
  
  self = (idr->wait_list).first;
  if (self != (idrent *)0x0) {
    do {
      iVar2 = idr->num_size;
      piVar3 = self->isoent;
      iVar4 = self->noff;
      if (iVar4 + iVar2 != piVar3->ext_off) {
        memmove(piVar3->identifier + (long)iVar4 + (long)iVar2,piVar3->identifier + piVar3->ext_off,
                (long)piVar3->ext_len + (long)idr->null_size);
        iVar4 = self->noff;
        piVar3 = self->isoent;
        piVar3->ext_off = iVar4 + iVar2;
        piVar3->id_len = iVar4 + iVar2 + piVar3->ext_len;
      }
      pcVar1 = piVar3->identifier;
      do {
        iVar2 = self->avail->rename_num;
        self->avail->rename_num = iVar2 + 1;
        (*fsetnum)((uchar *)(pcVar1 + iVar4),iVar2);
        iVar2 = __archive_rb_tree_insert_node(&idr->rbtree,&self->rbnode);
      } while (iVar2 == 0);
      self = self->wnext;
    } while (self != (idrent *)0x0);
  }
  return;
}

Assistant:

static void
idr_resolve(struct idr *idr, void (*fsetnum)(unsigned char *p, int num))
{
	struct idrent *n;
	unsigned char *p;

	for (n = idr->wait_list.first; n != NULL; n = n->wnext) {
		idr_extend_identifier(n, idr->num_size, idr->null_size);
		p = (unsigned char *)n->isoent->identifier + n->noff;
		do {
			fsetnum(p, n->avail->rename_num++);
		} while (!__archive_rb_tree_insert_node(
		    &(idr->rbtree), &(n->rbnode)));
	}
}